

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::setReadOnly(QLineEdit *this,bool enable)

{
  State state;
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  QLineEditPrivate *this_00;
  byte in_SIL;
  CursorShape CVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QLineEditPrivate *d;
  QEvent event;
  QAccessibleStateChangeEvent ev;
  State changedState;
  undefined7 in_stack_ffffffffffffff98;
  QWidget *cursor;
  QWidget *in_stack_ffffffffffffffa8;
  QCursor local_48;
  ulong local_40;
  QAccessibleStateChangeEvent local_38 [43];
  bool on;
  WidgetAttribute attribute;
  QWidget *this_01;
  
  this_01 = *(QWidget **)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  cursor = in_RDI;
  this_00 = d_func((QLineEdit *)0x5c5602);
  bVar3 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)this_00->control);
  if (bVar3 != (bool)(bVar2 & 1)) {
    QWidgetLineControl::setReadOnly((QWidgetLineControl *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
    QLineEditPrivate::setClearButtonEnabled
              ((QLineEditPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffff98),
               SUB81((ulong)this_00 >> 0x38,0));
    uVar1 = (ulong)stack0xfffffffffffffff0;
    attribute = (WidgetAttribute)((ulong)stack0xfffffffffffffff0 >> 0x20);
    on = SUB81(uVar1 >> 0x18,0);
    QWidget::setAttribute(this_01,attribute,on);
    stack0xfffffffffffffff0 = (undefined1 *)uVar1;
    QLineEditPrivate::shouldEnableInputMethod((QLineEditPrivate *)0x5c5683);
    uVar1 = (ulong)stack0xfffffffffffffff0;
    attribute = (WidgetAttribute)((ulong)stack0xfffffffffffffff0 >> 0x20);
    on = SUB81(uVar1 >> 0x18,0);
    QWidget::setAttribute(this_01,attribute,on);
    CVar4 = IBeamCursor;
    if ((bVar2 & 1) != 0) {
      CVar4 = ArrowCursor;
    }
    QCursor::QCursor(&local_48,CVar4);
    QWidget::setCursor(in_stack_ffffffffffffffa8,(QCursor *)cursor);
    QCursor::~QCursor(&local_48);
    QEvent::QEvent((QEvent *)&stack0xffffffffffffffa8,ReadOnlyChange);
    QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&stack0xffffffffffffffa8);
    QWidget::update(in_RDI);
    stack0xfffffffffffffff0 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessible::State::State((State *)0x5c571e);
    stack0xfffffffffffffff0 =
         (undefined1 *)((ulong)stack0xfffffffffffffff0 & 0xfffffffffffffeff | 0x100);
    memset(local_38,0xaa,0x28);
    local_40 = (ulong)stack0xfffffffffffffff0;
    state._7_1_ = bVar2;
    state._0_7_ = in_stack_ffffffffffffff98;
    QAccessibleStateChangeEvent::QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)this_00,&in_RDI->super_QObject,state);
    QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent(local_38);
    QEvent::~QEvent((QEvent *)&stack0xffffffffffffffa8);
  }
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::setReadOnly(bool enable)
{
    Q_D(QLineEdit);
    if (d->control->isReadOnly() != enable) {
        d->control->setReadOnly(enable);
        d->setClearButtonEnabled(!enable);
        setAttribute(Qt::WA_MacShowFocusRect, !enable);
        setAttribute(Qt::WA_InputMethodEnabled, d->shouldEnableInputMethod());
#ifndef QT_NO_CURSOR
        setCursor(enable ? Qt::ArrowCursor : Qt::IBeamCursor);
#endif
        QEvent event(QEvent::ReadOnlyChange);
        QCoreApplication::sendEvent(this, &event);
        update();
#if QT_CONFIG(accessibility)
        QAccessible::State changedState;
        changedState.readOnly = true;
        QAccessibleStateChangeEvent ev(this, changedState);
        QAccessible::updateAccessibility(&ev);
#endif
    }
}